

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void __thiscall
Fossilize::StateRecorder::Impl::push_unregister_locked<VkShaderModule_T*>
          (Impl *this,VkStructureType sType,VkShaderModule_T *obj)

{
  value_type local_40;
  VkShaderModule_T *local_20;
  VkShaderModule_T *obj_local;
  Impl *pIStack_10;
  VkStructureType sType_local;
  Impl *this_local;
  
  local_40.type = sType;
  local_20 = obj;
  obj_local._4_4_ = sType;
  pIStack_10 = this;
  local_40.handle = api_object_cast<unsigned_long,VkShaderModule_T*>(obj);
  local_40.create_info = (void *)0x0;
  local_40.custom_hash = 0;
  std::
  queue<Fossilize::WorkItem,_std::deque<Fossilize::WorkItem,_std::allocator<Fossilize::WorkItem>_>_>
  ::push(&this->record_queue,&local_40);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void StateRecorder::Impl::push_unregister_locked(VkStructureType sType, T obj)
{
	record_queue.push({sType, api_object_cast<uint64_t>(obj), nullptr, 0});
	record_cv.notify_one();
}